

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::r_formatter<spdlog::details::scoped_padder>::format
          (r_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  tm *in_RDX;
  scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffff88;
  scoped_padder *in_stack_ffffffffffffff90;
  memory_buf_t *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa1;
  undefined1 uVar1;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 uVar3;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  scoped_padder *in_stack_ffffffffffffffb0;
  
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,
             (padding_info *)
             CONCAT44(in_stack_ffffffffffffffa4,
                      CONCAT13(in_stack_ffffffffffffffa3,
                               CONCAT12(in_stack_ffffffffffffffa2,
                                        CONCAT11(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0
                                                )))),in_stack_ffffffffffffff98);
  to12h(in_RDX);
  fmt_helper::pad2(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  uVar3 = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back
            ((buffer<char> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  fmt_helper::pad2(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  uVar2 = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back
            ((buffer<char> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  fmt_helper::pad2(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  uVar1 = 0x20;
  ::fmt::v7::detail::buffer<char>::push_back
            ((buffer<char> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ampm(in_RDX);
  ::fmt::v7::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  view.size_ = (size_t)in_stack_ffffffffffffffb0;
  view.data_ = in_stack_ffffffffffffffa8;
  fmt_helper::append_string_view
            (view,(memory_buf_t *)
                  CONCAT44(in_stack_ffffffffffffffa4,
                           CONCAT13(uVar3,CONCAT12(uVar2,CONCAT11(uVar1,in_stack_ffffffffffffffa0)))
                          ));
  scoped_padder::~scoped_padder(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }